

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::VectorArrayBuffer::VectorArrayBuffer
          (VectorArrayBuffer *this,
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_vector,
          idx_t array_size,idx_t initial_capacity)

{
  VectorBuffer::VectorBuffer(&this->super_VectorBuffer,ARRAY_BUFFER);
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorArrayBuffer_01775a30;
  (this->child).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
       (child_vector->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
  (child_vector->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  this->array_size = array_size;
  this->size = initial_capacity;
  return;
}

Assistant:

VectorArrayBuffer::VectorArrayBuffer(unique_ptr<Vector> child_vector, idx_t array_size, idx_t initial_capacity)
    : VectorBuffer(VectorBufferType::ARRAY_BUFFER), child(std::move(child_vector)), array_size(array_size),
      size(initial_capacity) {
	D_ASSERT(array_size != 0);
}